

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

iterator __thiscall
GF2::MI<8ul,GF2::MOGrevlex<8ul>>::Insert<8ul,GF2::MOGrevlex<8ul>>
          (MI<8ul,GF2::MOGrevlex<8ul>> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  bool bVar1;
  iterator pos;
  iterator local_38;
  _List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> local_30;
  
  local_38._M_node = (_List_node_base *)0x0;
  bVar1 = MI<8UL,_GF2::MOGrevlex<8UL>_>::Find
                    ((MI<8UL,_GF2::MOGrevlex<8UL>_> *)this,polyRight,&local_38);
  if (!bVar1) {
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_prev =
         local_30._M_impl._M_node.super__List_node_base._M_next;
    local_38 = std::__cxx11::
               list<GF2::MP<8ul,GF2::MOGrevlex<8ul>>,std::allocator<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>>
               ::emplace<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>
                         ((list<GF2::MP<8ul,GF2::MOGrevlex<8ul>>,std::allocator<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>>
                           *)this,local_38._M_node,
                          (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                          local_30._M_impl._M_node.super__List_node_base._M_next);
    MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
              ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)(local_38._M_node + 1),polyRight);
    std::__cxx11::_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::_M_clear(&local_30);
  }
  return (iterator)local_38._M_node;
}

Assistant:

iterator Insert(const MP<_m, _O1>& polyRight)
	{	
		assert(!polyRight.IsEmpty());
		iterator pos;
		if (!Find(polyRight, pos))
			*(pos = insert(pos, MP<_n, _O>(_order))) = polyRight;
		return pos;
	}